

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O1

Type * __thiscall
spvtools::opt::ConvertToSampledImagePass::GetVariableType
          (ConvertToSampledImagePass *this,Instruction *variable)

{
  IRContext *this_00;
  TypeManager *this_01;
  uint32_t id;
  int iVar1;
  Type *pTVar2;
  undefined4 extraout_var;
  
  if (variable->opcode_ == OpVariable) {
    this_00 = (this->super_Pass).context_;
    if ((this_00->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
      IRContext::BuildTypeManager(this_00);
    }
    this_01 = (this_00->type_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
    id = 0;
    if (variable->has_type_id_ == true) {
      id = Instruction::GetSingleWordOperand(variable,0);
    }
    pTVar2 = analysis::TypeManager::GetType(this_01,id);
    iVar1 = (*pTVar2->_vptr_Type[0x1f])(pTVar2);
    if (CONCAT44(extraout_var,iVar1) == 0) {
      pTVar2 = (Type *)0x0;
    }
    else {
      pTVar2 = *(Type **)(CONCAT44(extraout_var,iVar1) + 0x28);
    }
    return pTVar2;
  }
  return (Type *)0x0;
}

Assistant:

const analysis::Type* ConvertToSampledImagePass::GetVariableType(
    const Instruction& variable) const {
  if (variable.opcode() != spv::Op::OpVariable) return nullptr;
  auto* type = context()->get_type_mgr()->GetType(variable.type_id());
  auto* pointer_type = type->AsPointer();
  if (!pointer_type) return nullptr;

  return pointer_type->pointee_type();
}